

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::jpolIndex_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  error_t eVar2;
  ulonglong uVar3;
  ostream *poVar4;
  E *this;
  char *left;
  stringstream ss;
  ostream local_190 [376];
  
  eVar2 = 7;
  if (jpolIndex_parse_argument(int,char*,argp_state*)::got_jpolIndex == '\0') {
    if (key == 0) {
      pvVar1 = state->input;
      uVar3 = strtoull(arg,&left,10);
      *(ulonglong *)((long)pvVar1 + 0x88) = uVar3;
      if (*left != '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar4 = std::operator<<(local_190,"Could not entirely parse the JPOL-INDEX: arg=\'");
        poVar4 = std::operator<<(poVar4,arg);
        poVar4 = std::operator<<(poVar4,"\', left=\'");
        poVar4 = std::operator<<(poVar4,left);
        poVar4 = std::operator<<(poVar4,"\', found jpol index=\'");
        poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
        std::operator<<(poVar4,"\'");
        this = (E *)__cxa_allocate_exception(0x28);
        E::E(this,&ss);
        __cxa_throw(this,&E::typeinfo,E::~E);
      }
      jpolIndex_parse_argument(int,char*,argp_state*)::got_jpolIndex = '\x01';
    }
    else {
      if (key != 0x1000002) {
        return 7;
      }
      argp_usage(state);
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

error_t
jpolIndex_parse_argument (int key, char *arg, struct argp_state *state)
{
    static bool got_jpolIndex = 0;
    //if we already got the dec-pomdp file return
    if(got_jpolIndex)
        return ARGP_ERR_UNKNOWN;
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case ARGP_KEY_NO_ARGS:
            argp_usage (state);
            break;
        case ARGP_KEY_ARG:
        {
            char *left;
#if USE_ARBITRARY_PRECISION_INDEX
            theArgumentsStruc->jpolIndex = arg;
#else
            theArgumentsStruc->jpolIndex = strtoull(arg,&left,10);
            if(*left != '\0')
            {
                std::stringstream ss;
                ss << "Could not entirely parse the JPOL-INDEX: arg='"
                   << arg <<"', left='" << left
                   << "', found jpol index='"<< theArgumentsStruc->jpolIndex
                   << "'";
                throw(E(ss));
            }
#endif
            got_jpolIndex = 1;
            break;
        }
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}